

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  uint id;
  ulong uVar1;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar2;
  bool bVar3;
  mapped_type *pmVar4;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar5;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__i;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar6;
  TypedID<(spirv_cross::Types)0> *__k;
  char *local_98;
  string initializer;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50 [32];
  
  uVar1 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (uVar1 != 0) {
    ppVar2 = (temporaries->
             super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
             ).ptr;
    lVar5 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    ::std::
    __introsort_loop<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
              (ppVar2,ppVar2 + uVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar1 < 0x11) {
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar2,ppVar2 + uVar1);
    }
    else {
      ppVar6 = ppVar2 + 0x10;
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar2,ppVar6);
      for (lVar5 = uVar1 * 8 + -0x80; lVar5 != 0; lVar5 = lVar5 + -8) {
        ::std::
        __unguarded_linear_insert<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                  (ppVar6);
        ppVar6 = ppVar6 + 1;
      }
    }
  }
  __k = &((temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).ptr)->second;
  for (lVar5 = (temporaries->
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               ).buffer_size << 3; lVar5 != 0; lVar5 = lVar5 + -8) {
    add_local_variable_name(this,__k->id);
    pmVar4 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_Compiler).ir.meta,__k);
    type = Compiler::get<spirv_cross::SPIRType>
                     (&this->super_Compiler,
                      (((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                         *)(__k + -1))->first).id);
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&initializer.field_2
    ;
    initializer._M_string_length = 0;
    initializer.field_2._M_local_buf[0] = '\0';
    initializer._M_dataplus._M_p = (pointer)ts_1;
    if ((this->options).force_zero_initialized_variables == true) {
      bVar3 = type_can_zero_initialize(this,type);
      if (bVar3) {
        (*(this->super_Compiler)._vptr_Compiler[0x33])
                  (local_50,this,
                   (ulong)(((pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
                             *)(__k + -1))->first).id);
        join<char_const(&)[4],std::__cxx11::string>
                  ((string *)local_70,(spirv_cross *)0x31e8c7,(char (*) [4])local_50,ts_1);
        ::std::__cxx11::string::operator=((string *)&initializer,(string *)local_70[0]._M_local_buf)
        ;
        ::std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
        ::std::__cxx11::string::~string(local_50);
      }
    }
    local_98 = flags_to_qualifiers_glsl(this,type,&(pmVar4->decoration).decoration_flags);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)__k->id,1);
    (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_70,this,type,local_50,0);
    statement<char_const*,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
              (this,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               &initializer,(char (*) [2])0x304bae);
    ::std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
    ::std::__cxx11::string::~string(local_50);
    local_70[0]._0_4_ = __k->id;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&(this->super_Compiler).hoisted_temporaries,
             (value_type *)&local_70[0]._M_allocated_capacity);
    local_70[0]._0_4_ = __k->id;
    ::std::__detail::
    _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&(this->super_Compiler).forced_temporaries,
             (value_type *)&local_70[0]._M_allocated_capacity);
    id = __k->id;
    (*(this->super_Compiler)._vptr_Compiler[6])(local_70,this,(ulong)id,1);
    local_50[0] = (string)0x1;
    Compiler::
    set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
              (&this->super_Compiler,id,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
               (TypedID<(spirv_cross::Types)1> *)(__k + -1),(bool *)local_50);
    ::std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
    ::std::__cxx11::string::~string((string *)&initializer);
    __k = __k + 2;
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		add_local_variable_name(tmp.second);
		auto &flags = ir.meta[tmp.second].decoration.decoration_flags;
		auto &type = get<SPIRType>(tmp.first);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);
	}
}